

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeInsert(BtCursor *pCur,BtreePayload *pX,int flags,int seekResult)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  Btree *pBtree;
  u8 uVar4;
  u8 uVar5;
  u8 uVar6;
  Pgno parent;
  char cVar7;
  int iVar8;
  uint uVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  u64 v;
  BtShared *pBVar14;
  u8 *__dest;
  void *pvVar15;
  uint uVar16;
  u8 *puVar17;
  uint uVar18;
  int loc;
  int rc;
  UnpackedRecord r;
  uint local_c4;
  int local_c0;
  Pgno local_bc;
  BtShared *local_b8;
  uint local_b0;
  int local_ac;
  BtCursor *local_a8;
  uint local_9c;
  u8 *local_98;
  uint local_8c;
  KeyInfo *local_88;
  BtreePayload *local_80;
  uint *local_78;
  BtShared *local_70;
  BtShared *local_68;
  BtreePayload local_60;
  
  pBtree = pCur->pBtree;
  pBVar14 = pBtree->pBt;
  uVar9 = local_c4;
  local_ac = seekResult;
  if ((pCur->curFlags & 0x20) != 0) {
    local_c4 = saveAllCursors(pBVar14,pCur->pgnoRoot,pCur);
    if (local_c4 != 0) {
      return local_c4;
    }
    uVar9 = 0;
    if ((seekResult != 0) && (pCur->iPage < '\0')) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12877,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
      return 0xb;
    }
  }
  local_c4 = uVar9;
  local_70 = pBVar14;
  if ((2 < pCur->eState) && (local_c4 = moveToRoot(pCur), (local_c4 & 0xffffffef) != 0)) {
    return local_c4;
  }
  if (pCur->pKeyInfo == (KeyInfo *)0x0) {
    if (pBtree->hasIncrblobCur != '\0') {
      invalidateIncrblobCursors(pBtree,pCur->pgnoRoot,pX->nKey,0);
    }
    if (((pCur->curFlags & 2) == 0) || (pX->nKey != (pCur->info).nKey)) {
      if (seekResult == 0) {
        iVar8 = sqlite3BtreeTableMoveto(pCur,pX->nKey,(uint)flags >> 3 & 1,&local_ac);
        if (iVar8 != 0) {
          return iVar8;
        }
        local_c4 = 0;
      }
    }
    else if (((pCur->info).nSize != 0) && ((pCur->info).nPayload == pX->nZero + pX->nData)) {
      iVar8 = btreeOverwriteCell(pCur,pX);
      return iVar8;
    }
  }
  else {
    if ((flags & 2U) == 0 && seekResult == 0) {
      if (pX->nMem == 0) {
        iVar8 = btreeMoveto(pCur,pX->pKey,pX->nKey,(uint)flags >> 3 & 1,&local_ac);
      }
      else {
        local_60.nKey = (sqlite3_int64)pX->aMem;
        local_60.aMem._6_1_ = 0;
        local_60._34_1_ = 0;
        local_60.pKey = pCur->pKeyInfo;
        local_60.aMem._4_2_ = pX->nMem;
        iVar8 = sqlite3BtreeIndexMoveto(pCur,(UnpackedRecord *)&local_60,&local_ac);
      }
      if (iVar8 != 0) {
        return iVar8;
      }
      local_c4 = 0;
    }
    if (local_ac == 0) {
      getCellInfo(pCur);
      if ((pCur->info).nKey == pX->nKey) {
        local_60.pData = pX->pKey;
        local_60.nData = (int)pX->nKey;
        local_60.nZero = 0;
        iVar8 = btreeOverwriteCell(pCur,&local_60);
        return iVar8;
      }
    }
  }
  local_b8 = (BtShared *)pCur->pPage;
  if (*(int *)((long)&local_b8->pCursor + 4) < 0) {
    if (pCur->eState < 2) {
      iVar8 = btreeComputeFreeSpace((MemPage *)local_b8);
    }
    else {
      iVar8 = 0xb;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x128f2,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    }
    if (iVar8 != 0) {
      return iVar8;
    }
    local_c4 = 0;
  }
  pBVar14 = local_70;
  puVar17 = local_70->pTmpSpace;
  local_98 = puVar17;
  if ((char)flags < '\0') {
    local_c4 = 0;
    uVar9 = 4;
    if (4 < local_70->nPreformatSize) {
      uVar9 = local_70->nPreformatSize;
    }
    uVar16 = local_c4;
    if ((local_70->autoVacuum != '\0') && (*(u16 *)((long)&local_b8->db + 6) < uVar9)) {
      local_b0 = uVar9;
      (*(code *)local_b8->pWriter)(local_b8,puVar17,&local_60);
      uVar9 = local_b0;
      uVar16 = local_c4;
      if ((uint)local_60.pData != local_60.pData._4_2_) {
        uVar16 = *(uint *)(puVar17 + ((ulong)local_b0 - 4));
        ptrmapPut(pBVar14,uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 |
                          uVar16 << 0x18,'\x03',*(Pgno *)((long)&local_b8->pPager + 4),
                  (int *)&local_c4);
        uVar16 = local_c4;
      }
    }
  }
  else {
    bVar1 = *(u8 *)((long)&local_b8->db + 2);
    local_c0 = flags;
    local_a8 = pCur;
    local_80 = pX;
    if (*(u8 *)((long)&local_b8->pPager + 1) == '\0') {
      pvVar15 = pX->pKey;
      uVar12 = pX->nKey;
      if ((uint)uVar12 < 0x80) {
        puVar17[bVar1] = (u8)uVar12;
        uVar9 = 1;
      }
      else {
        uVar9 = sqlite3PutVarint(puVar17 + bVar1,(long)(int)(uint)uVar12);
        uVar9 = uVar9 & 0xff;
      }
      iVar8 = uVar9 + bVar1;
      v = uVar12 & 0xffffffff;
      puVar17 = local_98;
    }
    else {
      uVar12 = (ulong)pX->nData;
      v = (long)pX->nZero + uVar12;
      pvVar15 = pX->pData;
      if ((uint)v < 0x80) {
        puVar17[bVar1] = (u8)v;
        uVar9 = 1;
      }
      else {
        uVar9 = sqlite3PutVarint(puVar17 + bVar1,v);
        uVar9 = uVar9 & 0xff;
      }
      iVar8 = sqlite3PutVarint(puVar17 + (uVar9 + bVar1),pX->nKey);
      iVar8 = iVar8 + uVar9 + bVar1;
    }
    __dest = puVar17 + iVar8;
    uVar2 = *(u16 *)((long)&local_b8->db + 6);
    iVar13 = (int)v;
    if ((int)(uint)uVar2 < iVar13) {
      uVar3 = *(ushort *)&local_b8->pCursor;
      local_68 = (BtShared *)local_b8->pSchema;
      local_88 = (KeyInfo *)0x0;
      uVar18 = (iVar13 - (uint)uVar3) % (local_68->usableSize - 4) + (uint)uVar3;
      if ((int)(uint)uVar2 < (int)uVar18) {
        uVar18 = (uint)uVar3;
      }
      local_b0 = iVar8 + uVar18 + 4;
      local_78 = (uint *)(puVar17 + (int)(uVar18 + iVar8));
      local_bc = 0;
      do {
        do {
          uVar16 = (uint)v;
          uVar9 = uVar18;
          if ((int)uVar16 < (int)uVar18) {
            uVar9 = uVar16;
          }
          uVar11 = (uint)uVar12;
          if ((int)uVar11 < (int)uVar9) {
            if ((int)uVar11 < 1) {
              memset(__dest,0,(long)(int)uVar9);
            }
            else {
              memcpy(__dest,pvVar15,uVar12 & 0xffffffff);
              uVar9 = uVar11;
            }
          }
          else {
            memcpy(__dest,pvVar15,(long)(int)uVar9);
          }
          pBVar14 = local_68;
          parent = local_bc;
          v = (u64)(uVar16 - uVar9);
          if (uVar16 - uVar9 == 0 || (int)uVar16 < (int)uVar9) {
            pCur = local_a8;
            pX = local_80;
            flags = local_c0;
            uVar9 = local_b0;
            uVar16 = 0;
            if (local_88 != (KeyInfo *)0x0) {
              sqlite3PagerUnrefNotNull((DbPage *)local_88[2].aColl[0]);
              pCur = local_a8;
              pX = local_80;
              flags = local_c0;
              uVar9 = local_b0;
            }
            goto LAB_00142f9f;
          }
          __dest = __dest + (int)uVar9;
          pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar9);
          uVar12 = (ulong)(uVar11 - uVar9);
          uVar18 = uVar18 - uVar9;
        } while (uVar18 != 0);
        local_60.pKey = (KeyInfo *)0x0;
        if (local_68->autoVacuum != '\0') {
          do {
            uVar16 = local_bc;
            local_bc = uVar16 + 1;
            uVar9 = 0;
            if (1 < local_bc) {
              iVar8 = (uVar16 - 1) - (uVar16 - 1) % (local_68->usableSize / 5 + 1);
              uVar9 = iVar8 + (uint)(iVar8 + 1U == (uint)sqlite3PendingByte / local_68->pageSize) +
                      2;
            }
          } while ((local_bc == uVar9) || (uVar16 == (uint)sqlite3PendingByte / local_68->pageSize))
          ;
          local_bc = uVar16 + 1;
        }
        local_9c = allocateBtreePage(local_68,(MemPage **)&local_60,&local_bc,local_bc,'\0');
        if (((local_9c == 0 && pBVar14->autoVacuum != '\0') &&
            (ptrmapPut(pBVar14,local_bc,'\x04' - (parent == 0),parent,(int *)&local_9c),
            local_9c != 0)) && ((KeyInfo *)local_60.pKey != (KeyInfo *)0x0)) {
          sqlite3PagerUnrefNotNull((DbPage *)((KeyInfo *)((long)local_60.pKey + 0x50))->aColl[0]);
        }
        uVar11 = local_9c;
        if (local_9c == 0) {
          *local_78 = local_bc >> 0x18 | (local_bc & 0xff0000) >> 8 | (local_bc & 0xff00) << 8 |
                      local_bc << 0x18;
          if (local_88 != (KeyInfo *)0x0) {
            sqlite3PagerUnrefNotNull((DbPage *)local_88[2].aColl[0]);
          }
          local_78 = *(uint **)((long)local_60.pKey + 0x50);
          *local_78 = 0;
          local_88 = (KeyInfo *)local_60.pKey;
          __dest = (u8 *)(*(long *)((long)local_60.pKey + 0x50) + 4);
          uVar18 = pBVar14->usableSize - 4;
        }
        else {
          uVar18 = 0;
          if (local_88 == (KeyInfo *)0x0) {
            local_8c = local_9c;
          }
          else {
            sqlite3PagerUnrefNotNull((DbPage *)local_88[2].aColl[0]);
            local_8c = uVar11;
          }
        }
        pCur = local_a8;
        pX = local_80;
        flags = local_c0;
        uVar9 = local_b0;
        uVar16 = local_8c;
      } while (uVar11 == 0);
    }
    else {
      uVar9 = 4;
      if (4 < iVar8 + iVar13) {
        uVar9 = iVar8 + iVar13;
      }
      iVar8 = (int)uVar12;
      memcpy(__dest,pvVar15,(long)iVar8);
      memset(__dest + iVar8,0,(long)(iVar13 - iVar8));
      pCur = local_a8;
      pX = local_80;
      flags = local_c0;
      uVar16 = 0;
    }
  }
LAB_00142f9f:
  local_c4 = uVar16;
  pBVar14 = local_b8;
  if (local_c4 != 0) {
    return local_c4;
  }
  uVar2 = pCur->ix;
  uVar16 = (uint)uVar2;
  if (local_ac != 0) {
    if ((local_ac < 0) && (*(u16 *)&local_b8->pPage1 != 0)) {
      pCur->ix = uVar2 + 1;
      uVar16 = (uint)(ushort)(uVar2 + 1);
      pCur->curFlags = pCur->curFlags & 0xfd;
    }
    goto LAB_00143181;
  }
  if (*(ushort *)&local_b8->pPage1 <= uVar2) {
    uVar10 = 0x12916;
    goto LAB_0014303d;
  }
  local_c4 = sqlite3PagerWrite((PgHdr *)local_b8->pNext);
  if (local_c4 == 0) {
    local_a8 = (BtCursor *)
               (pBVar14->xFreeSchema +
               (CONCAT11(*(u8 *)((long)&pBVar14->pHasContent->iSize + (ulong)uVar2 * 2),
                         *(u8 *)((long)&pBVar14->pHasContent->iSize + (ulong)uVar2 * 2 + 1)) &
               *(u16 *)((long)&pBVar14->pPage1 + 2)));
    if (*(u8 *)&pBVar14->db == '\0') {
      uVar4 = local_a8->curFlags;
      uVar5 = local_a8->curPagerFlags;
      uVar6 = local_a8->hints;
      local_98[0] = local_a8->eState;
      local_98[1] = uVar4;
      local_98[2] = uVar5;
      local_98[3] = uVar6;
    }
    local_c0 = flags;
    (*(code *)pBVar14->pWriter)(pBVar14,local_a8,&local_60);
    pBVar14 = local_70;
    uVar18 = 0;
    if ((uint)local_60.pData != local_60.pData._4_2_) {
      uVar18 = clearCellOverflow((MemPage *)local_b8,&local_a8->eState,(CellInfo *)&local_60);
    }
    flags = local_c0;
    pCur->curFlags = pCur->curFlags & 0xfb;
    local_c4 = uVar18;
    if (uVar9 == local_60.pData._6_2_) {
      if (((uint)local_60.pData == local_60.pData._4_2_) &&
         ((pBVar14->autoVacuum == '\0' || ((int)uVar9 < (int)(uint)*(ushort *)&local_b8->pCursor))))
      {
        if (local_a8 <
            (BtCursor *)(local_b8->xFreeSchema + (ulong)*(u8 *)((long)&local_b8->db + 1) + 10)) {
          uVar10 = 0x12931;
LAB_0014303d:
          pBVar14 = (BtShared *)0xb;
          sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar10,
                      "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
        }
        else {
          if (local_b8->mutex <
              (sqlite3_mutex *)((long)local_a8->aiIdx + ((long)(int)uVar9 - 0x58U))) {
            uVar10 = 0x12934;
            goto LAB_0014303d;
          }
          memcpy(local_a8,local_98,(long)(int)uVar9);
          pBVar14 = (BtShared *)0x0;
        }
        cVar7 = '\x01';
        goto LAB_0014316a;
      }
    }
    dropCell((MemPage *)local_b8,(uint)uVar2,(uint)local_60.pData._6_2_,(int *)&local_c4);
    cVar7 = (local_c4 != 0) * '\x02';
    flags = local_c0;
  }
  else {
    cVar7 = '\x02';
  }
LAB_0014316a:
  if (cVar7 != '\0') {
    if (cVar7 == '\x02') {
      return local_c4;
    }
    return (int)pBVar14;
  }
LAB_00143181:
  pBVar14 = local_b8;
  insertCell((MemPage *)local_b8,uVar16,local_98,uVar9,(u8 *)0x0,0,(int *)&local_c4);
  (pCur->info).nSize = 0;
  if (*(u8 *)((long)&pBVar14->db + 4) != '\0') {
    pCur->curFlags = pCur->curFlags & 0xfd;
    local_c4 = balance(pCur);
    pCur->pPage->nOverflow = '\0';
    pCur->eState = '\x01';
    if ((local_c4 == 0 & (byte)flags >> 1) == 1) {
      btreeReleaseAllCursorPages(pCur);
      if (pCur->pKeyInfo != (KeyInfo *)0x0) {
        pvVar15 = sqlite3Malloc(pX->nKey);
        pCur->pKey = pvVar15;
        if (pvVar15 == (void *)0x0) {
          local_c4 = 7;
        }
        else {
          memcpy(pvVar15,pX->pKey,pX->nKey);
        }
      }
      pCur->eState = '\x03';
      pCur->nKey = pX->nKey;
    }
  }
  return local_c4;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeInsert(
  BtCursor *pCur,                /* Insert data into the table of this cursor */
  const BtreePayload *pX,        /* Content of the row to be inserted */
  int flags,                     /* True if this is likely an append */
  int seekResult                 /* Result of prior IndexMoveto() call */
){
  int rc;
  int loc = seekResult;          /* -1: before desired location  +1: after */
  int szNew = 0;
  int idx;
  MemPage *pPage;
  Btree *p = pCur->pBtree;
  BtShared *pBt = p->pBt;
  unsigned char *oldCell;
  unsigned char *newCell = 0;

  assert( (flags & (BTREE_SAVEPOSITION|BTREE_APPEND|BTREE_PREFORMAT))==flags );
  assert( (flags & BTREE_PREFORMAT)==0 || seekResult || pCur->pKeyInfo==0 );

  /* Save the positions of any other cursors open on this table.
  **
  ** In some cases, the call to btreeMoveto() below is a no-op. For
  ** example, when inserting data into a table with auto-generated integer
  ** keys, the VDBE layer invokes sqlite3BtreeLast() to figure out the
  ** integer key to use. It then calls this function to actually insert the
  ** data into the intkey B-Tree. In this case btreeMoveto() recognizes
  ** that the cursor is already where it needs to be and returns without
  ** doing any work. To avoid thwarting these optimizations, it is important
  ** not to clear the cursor here.
  */
  if( pCur->curFlags & BTCF_Multiple ){
    rc = saveAllCursors(pBt, pCur->pgnoRoot, pCur);
    if( rc ) return rc;
    if( loc && pCur->iPage<0 ){
      /* This can only happen if the schema is corrupt such that there is more
      ** than one table or index with the same root page as used by the cursor.
      ** Which can only happen if the SQLITE_NoSchemaError flag was set when
      ** the schema was loaded. This cannot be asserted though, as a user might
      ** set the flag, load the schema, and then unset the flag.  */
      return SQLITE_CORRUPT_BKPT;
    }
  }

  /* Ensure that the cursor is not in the CURSOR_FAULT state and that it
  ** points to a valid cell.
  */
  if( pCur->eState>=CURSOR_REQUIRESEEK ){
    testcase( pCur->eState==CURSOR_REQUIRESEEK );
    testcase( pCur->eState==CURSOR_FAULT );
    rc = moveToRoot(pCur);
    if( rc && rc!=SQLITE_EMPTY ) return rc;
  }

  assert( cursorOwnsBtShared(pCur) );
  assert( (pCur->curFlags & BTCF_WriteFlag)!=0
              && pBt->inTransaction==TRANS_WRITE
              && (pBt->btsFlags & BTS_READ_ONLY)==0 );
  assert( hasSharedCacheTableLock(p, pCur->pgnoRoot, pCur->pKeyInfo!=0, 2) );

  /* Assert that the caller has been consistent. If this cursor was opened
  ** expecting an index b-tree, then the caller should be inserting blob
  ** keys with no associated data. If the cursor was opened expecting an
  ** intkey table, the caller should be inserting integer keys with a
  ** blob of associated data.  */
  assert( (flags & BTREE_PREFORMAT) || (pX->pKey==0)==(pCur->pKeyInfo==0) );

  if( pCur->pKeyInfo==0 ){
    assert( pX->pKey==0 );
    /* If this is an insert into a table b-tree, invalidate any incrblob
    ** cursors open on the row being replaced */
    if( p->hasIncrblobCur ){
      invalidateIncrblobCursors(p, pCur->pgnoRoot, pX->nKey, 0);
    }

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
#ifdef SQLITE_DEBUG
    if( flags & BTREE_SAVEPOSITION ){
      assert( pCur->curFlags & BTCF_ValidNKey );
      assert( pX->nKey==pCur->info.nKey );
      assert( loc==0 );
    }
#endif

    /* On the other hand, BTREE_SAVEPOSITION==0 does not imply
    ** that the cursor is not pointing to a row to be overwritten.
    ** So do a complete check.
    */
    if( (pCur->curFlags&BTCF_ValidNKey)!=0 && pX->nKey==pCur->info.nKey ){
      /* The cursor is pointing to the entry that is to be
      ** overwritten */
      assert( pX->nData>=0 && pX->nZero>=0 );
      if( pCur->info.nSize!=0
       && pCur->info.nPayload==(u32)pX->nData+pX->nZero
      ){
        /* New entry is the same size as the old.  Do an overwrite */
        return btreeOverwriteCell(pCur, pX);
      }
      assert( loc==0 );
    }else if( loc==0 ){
      /* The cursor is *not* pointing to the cell to be overwritten, nor
      ** to an adjacent cell.  Move the cursor so that it is pointing either
      ** to the cell to be overwritten or an adjacent cell.
      */
      rc = sqlite3BtreeTableMoveto(pCur, pX->nKey,
               (flags & BTREE_APPEND)!=0, &loc);
      if( rc ) return rc;
    }
  }else{
    /* This is an index or a WITHOUT ROWID table */

    /* If BTREE_SAVEPOSITION is set, the cursor must already be pointing
    ** to a row with the same key as the new entry being inserted.
    */
    assert( (flags & BTREE_SAVEPOSITION)==0 || loc==0 );

    /* If the cursor is not already pointing either to the cell to be
    ** overwritten, or if a new cell is being inserted, if the cursor is
    ** not pointing to an immediately adjacent cell, then move the cursor
    ** so that it does.
    */
    if( loc==0 && (flags & BTREE_SAVEPOSITION)==0 ){
      if( pX->nMem ){
        UnpackedRecord r;
        r.pKeyInfo = pCur->pKeyInfo;
        r.aMem = pX->aMem;
        r.nField = pX->nMem;
        r.default_rc = 0;
        r.eqSeen = 0;
        rc = sqlite3BtreeIndexMoveto(pCur, &r, &loc);
      }else{
        rc = btreeMoveto(pCur, pX->pKey, pX->nKey,
                    (flags & BTREE_APPEND)!=0, &loc);
      }
      if( rc ) return rc;
    }

    /* If the cursor is currently pointing to an entry to be overwritten
    ** and the new content is the same as as the old, then use the
    ** overwrite optimization.
    */
    if( loc==0 ){
      getCellInfo(pCur);
      if( pCur->info.nKey==pX->nKey ){
        BtreePayload x2;
        x2.pData = pX->pKey;
        x2.nData = pX->nKey;
        x2.nZero = 0;
        return btreeOverwriteCell(pCur, &x2);
      }
    }
  }
  assert( pCur->eState==CURSOR_VALID
       || (pCur->eState==CURSOR_INVALID && loc) );

  pPage = pCur->pPage;
  assert( pPage->intKey || pX->nKey>=0 || (flags & BTREE_PREFORMAT) );
  assert( pPage->leaf || !pPage->intKey );
  if( pPage->nFree<0 ){
    if( NEVER(pCur->eState>CURSOR_INVALID) ){
     /* ^^^^^--- due to the moveToRoot() call above */
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = btreeComputeFreeSpace(pPage);
    }
    if( rc ) return rc;
  }

  TRACE(("INSERT: table=%d nkey=%lld ndata=%d page=%d %s\n",
          pCur->pgnoRoot, pX->nKey, pX->nData, pPage->pgno,
          loc==0 ? "overwrite" : "new entry"));
  assert( pPage->isInit || CORRUPT_DB );
  newCell = pBt->pTmpSpace;
  assert( newCell!=0 );
  if( flags & BTREE_PREFORMAT ){
    rc = SQLITE_OK;
    szNew = pBt->nPreformatSize;
    if( szNew<4 ) szNew = 4;
    if( ISAUTOVACUUM && szNew>pPage->maxLocal ){
      CellInfo info;
      pPage->xParseCell(pPage, newCell, &info);
      if( info.nPayload!=info.nLocal ){
        Pgno ovfl = get4byte(&newCell[szNew-4]);
        ptrmapPut(pBt, ovfl, PTRMAP_OVERFLOW1, pPage->pgno, &rc);
      }
    }
  }else{
    rc = fillInCell(pPage, newCell, pX, &szNew);
  }
  if( rc ) goto end_insert;
  assert( szNew==pPage->xCellSize(pPage, newCell) );
  assert( szNew <= MX_CELL_SIZE(pBt) );
  idx = pCur->ix;
  if( loc==0 ){
    CellInfo info;
    assert( idx>=0 );
    if( idx>=pPage->nCell ){
      return SQLITE_CORRUPT_BKPT;
    }
    rc = sqlite3PagerWrite(pPage->pDbPage);
    if( rc ){
      goto end_insert;
    }
    oldCell = findCell(pPage, idx);
    if( !pPage->leaf ){
      memcpy(newCell, oldCell, 4);
    }
    BTREE_CLEAR_CELL(rc, pPage, oldCell, info);
    testcase( pCur->curFlags & BTCF_ValidOvfl );
    invalidateOverflowCache(pCur);
    if( info.nSize==szNew && info.nLocal==info.nPayload
     && (!ISAUTOVACUUM || szNew<pPage->minLocal)
    ){
      /* Overwrite the old cell with the new if they are the same size.
      ** We could also try to do this if the old cell is smaller, then add
      ** the leftover space to the free list.  But experiments show that
      ** doing that is no faster then skipping this optimization and just
      ** calling dropCell() and insertCell().
      **
      ** This optimization cannot be used on an autovacuum database if the
      ** new entry uses overflow pages, as the insertCell() call below is
      ** necessary to add the PTRMAP_OVERFLOW1 pointer-map entry.  */
      assert( rc==SQLITE_OK ); /* clearCell never fails when nLocal==nPayload */
      if( oldCell < pPage->aData+pPage->hdrOffset+10 ){
        return SQLITE_CORRUPT_BKPT;
      }
      if( oldCell+szNew > pPage->aDataEnd ){
        return SQLITE_CORRUPT_BKPT;
      }
      memcpy(oldCell, newCell, szNew);
      return SQLITE_OK;
    }
    dropCell(pPage, idx, info.nSize, &rc);
    if( rc ) goto end_insert;
  }else if( loc<0 && pPage->nCell>0 ){
    assert( pPage->leaf );
    idx = ++pCur->ix;
    pCur->curFlags &= ~BTCF_ValidNKey;
  }else{
    assert( pPage->leaf );
  }
  insertCell(pPage, idx, newCell, szNew, 0, 0, &rc);
  assert( pPage->nOverflow==0 || rc==SQLITE_OK );
  assert( rc!=SQLITE_OK || pPage->nCell>0 || pPage->nOverflow>0 );

  /* If no error has occurred and pPage has an overflow cell, call balance()
  ** to redistribute the cells within the tree. Since balance() may move
  ** the cursor, zero the BtCursor.info.nSize and BTCF_ValidNKey
  ** variables.
  **
  ** Previous versions of SQLite called moveToRoot() to move the cursor
  ** back to the root page as balance() used to invalidate the contents
  ** of BtCursor.apPage[] and BtCursor.aiIdx[]. Instead of doing that,
  ** set the cursor state to "invalid". This makes common insert operations
  ** slightly faster.
  **
  ** There is a subtle but important optimization here too. When inserting
  ** multiple records into an intkey b-tree using a single cursor (as can
  ** happen while processing an "INSERT INTO ... SELECT" statement), it
  ** is advantageous to leave the cursor pointing to the last entry in
  ** the b-tree if possible. If the cursor is left pointing to the last
  ** entry in the table, and the next row inserted has an integer key
  ** larger than the largest existing key, it is possible to insert the
  ** row without seeking the cursor. This can be a big performance boost.
  */
  pCur->info.nSize = 0;
  if( pPage->nOverflow ){
    assert( rc==SQLITE_OK );
    pCur->curFlags &= ~(BTCF_ValidNKey);
    rc = balance(pCur);

    /* Must make sure nOverflow is reset to zero even if the balance()
    ** fails. Internal data structure corruption will result otherwise.
    ** Also, set the cursor state to invalid. This stops saveCursorPosition()
    ** from trying to save the current position of the cursor.  */
    pCur->pPage->nOverflow = 0;
    pCur->eState = CURSOR_INVALID;
    if( (flags & BTREE_SAVEPOSITION) && rc==SQLITE_OK ){
      btreeReleaseAllCursorPages(pCur);
      if( pCur->pKeyInfo ){
        assert( pCur->pKey==0 );
        pCur->pKey = sqlite3Malloc( pX->nKey );
        if( pCur->pKey==0 ){
          rc = SQLITE_NOMEM;
        }else{
          memcpy(pCur->pKey, pX->pKey, pX->nKey);
        }
      }
      pCur->eState = CURSOR_REQUIRESEEK;
      pCur->nKey = pX->nKey;
    }
  }
  assert( pCur->iPage<0 || pCur->pPage->nOverflow==0 );

end_insert:
  return rc;
}